

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAdapter::makeZhouRose
          (EAMAdapter *this,RealType re,RealType fe,RealType rhoe,RealType alpha,RealType beta,
          RealType A,RealType B,RealType kappa,RealType lambda,RealType F0)

{
  AtomType *pAVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  RealType local_198;
  RealType local_190;
  shared_ptr<OpenMD::GenericData> local_188;
  shared_ptr<OpenMD::GenericData> local_178;
  undefined4 local_168;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150 [16];
  RealType local_140;
  ZhouParameters local_138;
  
  local_1d8.field_2._M_allocated_capacity = (size_type)re;
  local_1d8.field_2._8_8_ = fe;
  local_1b8 = rhoe;
  local_1b0 = alpha;
  local_1a8 = beta;
  local_1a0 = A;
  local_198 = B;
  local_190 = kappa;
  bVar2 = isEAM(this);
  if (bVar2) {
    AtomType::removeProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)ZhouTypeID_abi_cxx11_);
  }
  local_160 = local_150;
  local_158 = 0;
  local_150[0] = 0;
  memset(&local_138.F,0,0xc0);
  local_168 = 5;
  local_140 = (RealType)local_1d8.field_2._M_allocated_capacity;
  local_138.re = (RealType)local_1d8.field_2._M_allocated_capacity;
  local_138.fe = (RealType)local_1d8.field_2._8_8_;
  local_138.rhoe = local_1b8;
  local_138.alpha = local_1b0;
  local_138.beta = local_1a8;
  local_138.A = local_1a0;
  local_138.B = local_198;
  local_138.kappa = local_190;
  local_138.lambda = lambda;
  local_138.F0 = F0;
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&local_1d8,(EAMParameters *)EAMtypeID_abi_cxx11_);
  local_178.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1d8._M_dataplus._M_p;
  local_178.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length;
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_178.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1d8._M_string_length);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (&local_1d8,(ZhouParameters *)ZhouTypeID_abi_cxx11_);
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1d8._M_dataplus._M_p;
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_string_length;
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1d8._M_string_length);
  ZhouParameters::~ZhouParameters(&local_138);
  std::__cxx11::string::~string((string *)&local_160);
  return;
}

Assistant:

void EAMAdapter::makeZhouRose(RealType re, RealType fe, RealType rhoe,
                                RealType alpha, RealType beta, RealType A,
                                RealType B, RealType kappa, RealType lambda,
                                RealType F0) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType         = eamZhouRose;
    eamParam.latticeConstant = re;
    zhouParam.re             = re;
    zhouParam.fe             = fe;
    zhouParam.rhoe           = rhoe;
    zhouParam.alpha          = alpha;
    zhouParam.beta           = beta;
    zhouParam.A              = A;
    zhouParam.B              = B;
    zhouParam.kappa          = kappa;
    zhouParam.lambda         = lambda;
    zhouParam.F0             = F0;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }